

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void wakeup(monst *mtmp)

{
  monst *mtmp_local;
  
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
  mtmp->meating = 0;
  setmangry(mtmp);
  if (mtmp->m_ap_type == '\0') {
    if (((flags.forcefight != '\0') && (flags.mon_moving == '\0')) &&
       ((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0)) {
      *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff7f;
      newsym((int)mtmp->mx,(int)mtmp->my);
    }
  }
  else {
    seemimic(mtmp);
  }
  return;
}

Assistant:

void wakeup(struct monst *mtmp)
{
	mtmp->msleeping = 0;
	mtmp->meating = 0;	/* assume there's no salvagable food left */
	setmangry(mtmp);
	if (mtmp->m_ap_type) seemimic(mtmp);
	else if (flags.forcefight && !flags.mon_moving && mtmp->mundetected) {
	    mtmp->mundetected = 0;
	    newsym(mtmp->mx, mtmp->my);
	}
}